

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O1

ssize_t __thiscall
blc::network::SSLSocket::read_abi_cxx11_(SSLSocket *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int *piVar2;
  exception *this_00;
  undefined4 in_register_00000034;
  char tmp;
  char local_61;
  timespec local_60;
  string local_50;
  
  (this->super_Socket).super_stream._vptr_stream = (_func_int **)&(this->super_Socket)._address;
  *(undefined8 *)&(this->super_Socket)._socket = 0;
  *(undefined1 *)&(this->super_Socket)._address._M_dataplus._M_p = 0;
  if (*(char *)(CONCAT44(in_register_00000034,__fd) + 0x78) == '\0') {
    this_00 = (exception *)__cxa_allocate_exception(0x78);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"not opened","");
    error::exception::exception(this_00,&local_50);
    __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
  }
  do {
    iVar1 = SSL_read(*(SSL **)(CONCAT44(in_register_00000034,__fd) + 0x80),&local_61,1);
    if (((iVar1 < 1) || (local_61 == '\0')) || (local_61 == '\n')) {
      return (ssize_t)this;
    }
    std::__cxx11::string::push_back((char)this);
    local_60.tv_sec = 0;
    local_60.tv_nsec = 1000000;
    do {
      iVar1 = nanosleep(&local_60,&local_60);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  } while( true );
}

Assistant:

std::string blc::network::SSLSocket::read() const {
	std::string	str;
	char		tmp;
	int		ret;

	if (this->_opened == false)
		throw blc::error::exception("not opened");
	while ((ret = SSL_read(this->_ssl, &tmp, 1)) > 0) {
		if (ret == -1)
			throw new blc::error::exception("read error");
		if (tmp == '\n' || tmp == '\0')
			break;
		str += tmp;
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(1));
	}
	return (str);
}